

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliReader.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::read_escaped_word_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,fast_istringstream *is)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  char c;
  bool escape;
  fast_istringstream *is_local;
  string *w;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar1 = false;
  while( true ) {
    while( true ) {
      bVar2 = anon_unknown.dwarf_989e2::fast_istringstream::good((fast_istringstream *)this);
      if (!bVar2) {
        return __return_storage_ptr__;
      }
      cVar3 = anon_unknown.dwarf_989e2::fast_istringstream::get((fast_istringstream *)this);
      if (!bVar1) break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar1 = false;
    }
    if ((cVar3 == '=') || (cVar3 == ',')) break;
    if (cVar3 == '\\') {
      bVar1 = true;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  anon_unknown.dwarf_989e2::fast_istringstream::unget((fast_istringstream *)this);
  return __return_storage_ptr__;
}

Assistant:

inline std::string read_escaped_word(fast_istringstream& is)
{
    std::string w;
    w.reserve(32);
    bool escape = false;

    while (is.good()) {
        char c = is.get();

        if (escape) {
            w.push_back(c == 'n' ? '\n' : c);
            escape = false;
        } else {
            if (c == '=' || c == ',') {
                is.unget();
                break;
            } else if (c == '\\') {
                escape = true;
            } else {
                w.push_back(c);
            }
        }
    }

    return w;
}